

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenStringSliceIter
          (BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef num)

{
  StringSliceIter *this;
  
  this = (StringSliceIter *)MixedArena::allocSpace(&module->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression._id =
       StringSliceIterId;
  (this->super_SpecificExpression<(wasm::Expression::Id)85>).super_Expression.type.id = 0;
  this->ref = ref;
  this->num = num;
  wasm::StringSliceIter::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenStringSliceIter(BinaryenModuleRef module,
                                              BinaryenExpressionRef ref,
                                              BinaryenExpressionRef num) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStringSliceIter((Expression*)ref, (Expression*)num));
}